

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::DescriptorProto::InternalSerializeWithCachedSizesToArray
          (DescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  uint uVar2;
  FieldDescriptorProto *pFVar3;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  DescriptorProto_ExtensionRange *this_02;
  MessageOptions *this_03;
  OneofDescriptorProto *this_04;
  DescriptorProto_ReservedRange *this_05;
  string *s;
  size_t __n;
  void *pvVar4;
  uint8 *puVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint8 *local_40;
  uint local_34;
  
  local_34 = (this->_has_bits_).has_bits_[0];
  local_40 = target;
  if ((local_34 & 1) != 0) {
    local_40 = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  iVar1 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    pFVar3 = (FieldDescriptorProto *)
             ((this->field_).super_RepeatedPtrFieldBase.rep_)->elements[iVar6];
    *local_40 = '\x12';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((pFVar3->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray(pFVar3,puVar5,stream);
  }
  iVar1 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_00 = (DescriptorProto *)
              ((this->nested_type_).super_RepeatedPtrFieldBase.rep_)->elements[iVar6];
    *local_40 = '\x1a';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = InternalSerializeWithCachedSizesToArray(this_00,puVar5,stream);
  }
  iVar1 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_01 = (EnumDescriptorProto *)
              ((this->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[iVar6];
    *local_40 = '\"';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_01->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = EnumDescriptorProto::InternalSerializeWithCachedSizesToArray(this_01,puVar5,stream);
  }
  iVar1 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_02 = (DescriptorProto_ExtensionRange *)
              ((this->extension_range_).super_RepeatedPtrFieldBase.rep_)->elements[iVar6];
    *local_40 = '*';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_02->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = DescriptorProto_ExtensionRange::InternalSerializeWithCachedSizesToArray
                         (this_02,puVar5,stream);
  }
  iVar1 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    pFVar3 = (FieldDescriptorProto *)
             ((this->extension_).super_RepeatedPtrFieldBase.rep_)->elements[iVar6];
    *local_40 = '2';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((pFVar3->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = FieldDescriptorProto::InternalSerializeWithCachedSizesToArray(pFVar3,puVar5,stream);
  }
  if ((local_34 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_03 = this->options_;
    *local_40 = ':';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_03->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = MessageOptions::InternalSerializeWithCachedSizesToArray(this_03,puVar5,stream);
  }
  iVar1 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_04 = (OneofDescriptorProto *)
              ((this->oneof_decl_).super_RepeatedPtrFieldBase.rep_)->elements[iVar6];
    *local_40 = 'B';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_04->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = OneofDescriptorProto::InternalSerializeWithCachedSizesToArray(this_04,puVar5,stream);
  }
  iVar1 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar1 != iVar6; iVar6 = iVar6 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_40);
    this_05 = (DescriptorProto_ReservedRange *)
              ((this->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[iVar6];
    *local_40 = 'J';
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_05->_cached_size_).size_.super___atomic_base<int>._M_i,local_40 + 1);
    local_40 = DescriptorProto_ReservedRange::InternalSerializeWithCachedSizesToArray
                         (this_05,puVar5,stream);
  }
  uVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  uVar7 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = 0;
  }
  for (; puVar5 = local_40, uVar8 != uVar7; uVar7 = uVar7 + 1) {
    s = (string *)((this->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements[uVar7];
    __n = s->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)local_40)))) {
      *local_40 = 'R';
      local_40[1] = (uint8)__n;
      memcpy(local_40 + 2,(s->_M_dataplus)._M_p,__n);
      local_40 = puVar5 + __n + 2;
    }
    else {
      local_40 = io::EpsCopyOutputStream::WriteStringOutline(stream,10,s,local_40);
    }
  }
  pvVar4 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    local_40 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe),local_40,stream);
  }
  return local_40;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* DescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_field_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_field(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_nested_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(3, this->_internal_nested_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(4, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_range_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(5, this->_internal_extension_range(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(6, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        7, _Internal::options(this), target, stream);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_oneof_decl_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(8, this->_internal_oneof_decl(i), target, stream);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_reserved_range_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(9, this->_internal_reserved_range(i), target, stream);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this->_internal_reserved_name_size(); i < n; i++) {
    const auto& s = this->_internal_reserved_name(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.reserved_name");
    target = stream->WriteString(10, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto)
  return target;
}